

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

get_result * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
          (get_result *__return_storage_ptr__,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  _Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> local_70;
  undefined1 local_50 [8];
  try_get_result_type result;
  
  result.super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_payload.
  _M_value.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
  super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
  super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged = false;
  do {
    try_get((try_get_result_type *)&local_70,this,k);
    std::_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::
    _M_move_assign((_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *
                   )local_50,&local_70);
    std::_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::_M_reset
              (&local_70);
  } while (result.
           super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
           _M_payload._M_value.
           super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
           super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
           super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged != true);
  std::_Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>::_Optional_base
            (&__return_storage_ptr__->
              super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>,
             (_Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false> *)local_50);
  std::_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::_M_reset
            ((_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *)
             local_50);
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::get_result olc_db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  try_get_result_type result;

  while (true) {
    result = try_get(k);
    if (result) break;
    // TODO(laurynas): upgrade to write locks to prevent starving after a
    // certain number of failures?
  }

  return *result;
}